

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O3

void Ptex::v2_2::(anonymous_namespace)::Apply<float,2>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  undefined8 *puVar1;
  float fVar2;
  undefined8 uVar3;
  byte bVar4;
  int iVar5;
  float *pfVar6;
  undefined8 *puVar7;
  long lVar8;
  float *pfVar9;
  int iVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  
  bVar4 = (k->res).ulog2;
  iVar10 = 2 << (bVar4 & 0x1f);
  lVar8 = (long)iVar10 * (long)k->vw;
  if ((int)lVar8 != 0) {
    puVar7 = (undefined8 *)((long)data + ((long)(k->v << (bVar4 & 0x1f)) + (long)k->u) * 8);
    puVar1 = (undefined8 *)((long)puVar7 + lVar8 * 4);
    pfVar9 = k->kv;
    iVar5 = k->uw;
    pfVar6 = k->ku;
    do {
      fVar13 = *pfVar6;
      fVar12 = fVar13 * (float)*puVar7;
      fVar13 = fVar13 * (float)((ulong)*puVar7 >> 0x20);
      if (iVar5 != 1) {
        lVar11 = 4;
        lVar8 = 0;
        do {
          uVar3 = *(undefined8 *)((long)puVar7 + lVar11 * 2);
          fVar2 = *(float *)((long)pfVar6 + lVar11);
          fVar12 = fVar12 + fVar2 * (float)uVar3;
          fVar13 = fVar13 + fVar2 * (float)((ulong)uVar3 >> 0x20);
          lVar8 = lVar8 + -8;
          lVar11 = lVar11 + 4;
        } while ((long)(iVar5 * 2) * -4 + 8 != lVar8);
        puVar7 = (undefined8 *)((long)puVar7 - lVar8);
      }
      fVar2 = *pfVar9;
      pfVar9 = pfVar9 + 1;
      *(ulong *)result =
           CONCAT44(fVar2 * fVar13 + (float)((ulong)*(undefined8 *)result >> 0x20),
                    fVar2 * fVar12 + (float)*(undefined8 *)result);
      puVar7 = (undefined8 *)((long)puVar7 + (long)(iVar10 + iVar5 * -2) * 4 + 8);
    } while (puVar7 != puVar1);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }